

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnLocalGetExpr
          (BinaryReaderInterp *this,Index param_1)

{
  pointer pTVar1;
  pointer pTVar2;
  Index IVar3;
  Result RVar4;
  Location loc_1;
  Location loc;
  Location local_b8;
  Location local_98;
  Var local_78;
  
  pTVar1 = (this->validator_).typechecker_.type_stack_.
           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar2 = (this->validator_).typechecker_.type_stack_.
           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_finish;
  IVar3 = SharedValidator::GetLocalCount(&this->validator_);
  local_98.field_1.field_0.last_column = 0;
  local_98.filename._M_len = (this->filename_)._M_len;
  local_98.filename._M_str = (this->filename_)._M_str;
  local_b8.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_b8.field_1.field_0.last_column = 0;
  local_b8.filename._M_len = (this->filename_)._M_len;
  local_b8.filename._M_str = (this->filename_)._M_str;
  local_98.field_1.field_1.offset = local_b8.field_1.field_1.offset;
  Var::Var(&local_78,param_1,&local_b8);
  RVar4 = SharedValidator::OnLocalGet(&this->validator_,&local_98,&local_78);
  Var::~Var(&local_78);
  if (RVar4.enum_ != Error) {
    Istream::Emit(this->istream_,LocalGet,
                  (int)((ulong)((long)pTVar2 - (long)pTVar1) >> 3) + (IVar3 - param_1));
  }
  return (Result)(uint)(RVar4.enum_ == Error);
}

Assistant:

Result BinaryReaderInterp::OnLocalGetExpr(Index local_index) {
  // Get the translated index before calling validator_.OnLocalGet because it
  // will update the type stack size. We need the index to be relative to the
  // old stack size.
  Index translated_local_index = TranslateLocalIndex(local_index);
  CHECK_RESULT(
      validator_.OnLocalGet(GetLocation(), Var(local_index, GetLocation())));
  istream_.Emit(Opcode::LocalGet, translated_local_index);
  return Result::Ok;
}